

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void Curl_attach_connection(Curl_easy *data,connectdata *conn)

{
  _func_void_Curl_easy_ptr_connectdata_ptr *p_Var1;
  
  data->conn = conn;
  Curl_llist_append(&conn->easyq,data,&data->conn_queue);
  if ((conn->handler != (Curl_handler *)0x0) &&
     (p_Var1 = conn->handler->attach, p_Var1 != (_func_void_Curl_easy_ptr_connectdata_ptr *)0x0)) {
    (*p_Var1)(data,conn);
  }
  Curl_conn_ev_data_attach(conn,data);
  return;
}

Assistant:

void Curl_attach_connection(struct Curl_easy *data,
                            struct connectdata *conn)
{
  DEBUGASSERT(data);
  DEBUGASSERT(!data->conn);
  DEBUGASSERT(conn);
  data->conn = conn;
  Curl_llist_append(&conn->easyq, data, &data->conn_queue);
  if(conn->handler && conn->handler->attach)
    conn->handler->attach(data, conn);
  Curl_conn_ev_data_attach(conn, data);
}